

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[27],float,char[3],float,char[3],float,char[3],float,char[131]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [27],float *RestArgs,char (*RestArgs_1) [3],float *RestArgs_2,
               char (*RestArgs_3) [3],float *RestArgs_4,char (*RestArgs_5) [3],float *RestArgs_6,
               char (*RestArgs_7) [131])

{
  size_t sVar1;
  
  sVar1 = strlen(*FirstArg);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(ss + 0x10),*FirstArg,sVar1);
  std::ostream::_M_insert<double>((double)*RestArgs);
  FormatStrSS<std::__cxx11::stringstream,char[3],float,char[3],float,char[3],float,char[131]>
            (ss,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5,RestArgs_6,RestArgs_7);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}